

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxout.cpp
# Opt level: O2

void __thiscall
AbstractTxOut_ConstractorGetterSetter_Test::TestBody
          (AbstractTxOut_ConstractorGetterSetter_Test *this)

{
  _Alloc_hider _Var1;
  char *pcVar2;
  Amount AVar3;
  undefined1 local_108 [32];
  AssertionResult gtest_ar_1;
  undefined1 local_d8 [56];
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_7;
  AbstractTxOut actual;
  
  cfd::core::AbstractTxOut::AbstractTxOut(&actual,&expect_value,&expect_locking_script);
  AVar3 = cfd::core::AbstractTxOut::GetValue(&actual);
  local_d8._0_8_ = AVar3.amount_;
  local_d8[8] = AVar3.ignore_check_;
  testing::internal::CmpHelperEQ<cfd::core::Amount,cfd::core::Amount>
            ((internal *)&gtest_ar,"expect_value","actual.GetValue()",&expect_value,
             (Amount *)local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x16,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  _Var1 = expect_script_hex_abi_cxx11_._M_dataplus;
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_d8,&actual);
  cfd::core::Script::GetScript((Script *)&gtest_ar,(Script *)local_d8);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_108,(Script *)&gtest_ar);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"expect_script_hex.c_str()",
             "actual.GetLockingScript().GetScript().GetHex().c_str()",_Var1._M_p,
             (char *)local_108._0_8_);
  std::__cxx11::string::~string((string *)local_108);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)local_d8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x18,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::AbstractTxOut::~AbstractTxOut(&actual);
  cfd::core::AbstractTxOut::AbstractTxOut(&actual,&expect_locking_script);
  local_108._0_8_ = (ulong)(uint)local_108._4_4_ << 0x20;
  AVar3 = cfd::core::AbstractTxOut::GetValue(&actual);
  local_d8._0_8_ = AVar3.amount_;
  local_d8[8] = AVar3.ignore_check_;
  testing::internal::CmpHelperEQ<int,cfd::core::Amount>
            ((internal *)&gtest_ar,"0","actual.GetValue()",(int *)local_108,(Amount *)local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x1d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  _Var1 = expect_script_hex_abi_cxx11_._M_dataplus;
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_d8,&actual);
  cfd::core::Script::GetScript((Script *)&gtest_ar,(Script *)local_d8);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_108,(Script *)&gtest_ar);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"expect_script_hex.c_str()",
             "actual.GetLockingScript().GetScript().GetHex().c_str()",_Var1._M_p,
             (char *)local_108._0_8_);
  std::__cxx11::string::~string((string *)local_108);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)local_d8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_) ==
        (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::AbstractTxOut::~AbstractTxOut(&actual);
  cfd::core::AbstractTxOut::AbstractTxOut(&actual);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(0);
  local_d8._0_8_ = AVar3.amount_;
  local_d8[8] = AVar3.ignore_check_;
  AVar3 = cfd::core::AbstractTxOut::GetValue(&actual);
  local_108._0_8_ = AVar3.amount_;
  local_108[8] = AVar3.ignore_check_;
  testing::internal::CmpHelperEQ<cfd::core::Amount,cfd::core::Amount>
            ((internal *)&gtest_ar,"Amount::CreateBySatoshiAmount(0)","actual.GetValue()",
             (Amount *)local_d8,(Amount *)local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x24,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_d8,&actual);
  cfd::core::Script::GetScript((Script *)&gtest_ar,(Script *)local_d8);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_108,(Script *)&gtest_ar);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"\"\"","actual.GetLockingScript().GetScript().GetHex().c_str()"
             ,"",(char *)local_108._0_8_);
  std::__cxx11::string::~string((string *)local_108);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)local_d8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if ((undefined8 *)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_) !=
        (undefined8 *)0x0) {
      pcVar2 = *(char **)CONCAT71(gtest_ar_1.message_.ptr_._1_7_,gtest_ar_1.message_.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x25,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  cfd::core::AbstractTxOut::~AbstractTxOut(&actual);
  cfd::core::AbstractTxOut::AbstractTxOut(&actual);
  AVar3 = cfd::core::Amount::CreateBySatoshiAmount(10);
  gtest_ar_1._0_8_ = AVar3.amount_;
  gtest_ar_1.message_.ptr_._0_1_ = AVar3.ignore_check_;
  cfd::core::AbstractTxOut::SetValue(&actual,(Amount *)&gtest_ar_1);
  AVar3 = cfd::core::AbstractTxOut::GetValue(&actual);
  local_d8._0_8_ = AVar3.amount_;
  local_d8[8] = AVar3.ignore_check_;
  testing::internal::CmpHelperEQ<cfd::core::Amount,cfd::core::Amount>
            ((internal *)&gtest_ar,"amt","actual.GetValue()",(Amount *)&gtest_ar_1,
             (Amount *)local_d8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_d8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x2c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_108,(Message *)local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_108);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::AbstractTxOut::GetLockingScript((Script *)local_d8,&actual);
  cfd::core::Script::GetScript((Script *)&gtest_ar,(Script *)local_d8);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_108,(Script *)&gtest_ar);
  pcVar2 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_7,"\"\"","actual.GetLockingScript().GetScript().GetHex().c_str()"
             ,"",(char *)local_108._0_8_);
  std::__cxx11::string::~string((string *)local_108);
  cfd::core::Script::~Script((Script *)&gtest_ar);
  cfd::core::Script::~Script((Script *)local_d8);
  if (gtest_ar_7.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    if (gtest_ar_7.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar_7.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_abstracttxout.cpp"
               ,0x2d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_d8,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_7.message_);
  cfd::core::AbstractTxOut::~AbstractTxOut(&actual);
  return;
}

Assistant:

TEST(AbstractTxOut, ConstractorGetterSetter) {
  {
    AbstractTxOut actual = AbstractTxOut(expect_value, expect_locking_script);
    EXPECT_EQ(expect_value, actual.GetValue());
    EXPECT_STREQ(expect_script_hex.c_str(),
                 actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut(expect_locking_script);
    EXPECT_EQ(0, actual.GetValue());
    EXPECT_STREQ(expect_script_hex.c_str(),
                 actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut();
    EXPECT_EQ(Amount::CreateBySatoshiAmount(0), actual.GetValue());
    EXPECT_STREQ("", actual.GetLockingScript().GetScript().GetHex().c_str());
  }

  {
    AbstractTxOut actual = AbstractTxOut();
    Amount amt = Amount::CreateBySatoshiAmount(int64_t{10});
    actual.SetValue(amt);
    EXPECT_EQ(amt, actual.GetValue());
    EXPECT_STREQ("", actual.GetLockingScript().GetScript().GetHex().c_str());
  }
}